

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

ON_BrepEdge * __thiscall
ON_Brep::NewEdge(ON_Brep *this,ON_BrepVertex *v0,ON_BrepVertex *v1,int c3i,ON_Interval *edomain,
                double edge_tolerance)

{
  ON_Interval proxy_curve_subdomain;
  bool bVar1;
  ON_Interval local_60;
  undefined1 local_50 [8];
  ON_Interval edom;
  ON_BrepEdge *edge;
  double edge_tolerance_local;
  ON_Interval *edomain_local;
  int c3i_local;
  ON_BrepVertex *v1_local;
  ON_BrepVertex *v0_local;
  ON_Brep *this_local;
  
  edom.m_t[1] = (double)NewEdge(this,c3i);
  ((ON_BrepEdge *)edom.m_t[1])->m_vi[0] = v0->m_vertex_index;
  ((ON_BrepEdge *)edom.m_t[1])->m_vi[1] = v1->m_vertex_index;
  ON_SimpleArray<int>::Append(&v0->m_ei,&((ON_BrepEdge *)edom.m_t[1])->m_edge_index);
  ON_SimpleArray<int>::Append(&v1->m_ei,(int *)((long)edom.m_t[1] + 0x4c));
  if ((edomain != (ON_Interval *)0x0) && (bVar1 = ON_Interval::IsIncreasing(edomain), bVar1)) {
    ON_Interval::ON_Interval((ON_Interval *)local_50);
    local_60 = ON_CurveProxy::ProxyCurveDomain((ON_CurveProxy *)edom.m_t[1]);
    ON_Interval::Intersection((ON_Interval *)local_50,&local_60,edomain);
    bVar1 = ON_Interval::IsIncreasing((ON_Interval *)local_50);
    if (bVar1) {
      proxy_curve_subdomain.m_t[1] = edom.m_t[0];
      proxy_curve_subdomain.m_t[0] = (double)local_50;
      ON_CurveProxy::SetProxyCurveDomain((ON_CurveProxy *)edom.m_t[1],proxy_curve_subdomain);
    }
  }
  *(double *)((long)edom.m_t[1] + 0x78) = edge_tolerance;
  return (ON_BrepEdge *)edom.m_t[1];
}

Assistant:

ON_BrepEdge& 
ON_Brep::NewEdge( ON_BrepVertex& v0, ON_BrepVertex& v1, 
                  int c3i, const ON_Interval* edomain,
                  double edge_tolerance )
{
  ON_BrepEdge& edge = NewEdge(c3i);
  edge.m_vi[0] = v0.m_vertex_index;
  edge.m_vi[1] = v1.m_vertex_index;
  v0.m_ei.Append(edge.m_edge_index);
  v1.m_ei.Append(edge.m_edge_index);
  if ( edomain && edomain->IsIncreasing() ) {
    ON_Interval edom;
    edom.Intersection( edge.ProxyCurveDomain(), *edomain );
    if ( edom.IsIncreasing() )
      edge.SetProxyCurveDomain(edom);
  }
  edge.m_tolerance = edge_tolerance;
  return edge;
}